

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLUri::initializeAuthority(XMLUri *this,XMLCh *uriSpec)

{
  long lVar1;
  int iVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  XMLCh *toDelete;
  ulong uVar4;
  undefined4 extraout_var_01;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  ulong uVar7;
  bool bVar8;
  ArrayJanitor<char16_t> portName;
  ArrayJanitor<char16_t> hostName;
  ArrayJanitor<char16_t> userName;
  undefined4 extraout_var_00;
  
  XVar3 = XMLString::stringLen(uriSpec);
  lVar1 = XVar3 * 2 + 2;
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar1);
  pXVar6 = (XMLCh *)CONCAT44(extraout_var,iVar2);
  ArrayJanitor<char16_t>::ArrayJanitor(&userName,pXVar6,this->fMemoryManager);
  iVar2 = XMLString::indexOf(uriSpec,L'@');
  if (iVar2 == -1) {
    pXVar6 = (XMLCh *)0x0;
    uVar7 = 0;
  }
  else {
    XMLString::subString(pXVar6,uriSpec,0,(long)iVar2,this->fMemoryManager);
    uVar7 = (ulong)(iVar2 + 1);
  }
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar1);
  toDelete = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
  ArrayJanitor<char16_t>::ArrayJanitor(&hostName,toDelete,this->fMemoryManager);
  pXVar5 = uriSpec + uVar7;
  if ((XVar3 < uVar7 || XVar3 - uVar7 == 0) || (uriSpec[uVar7] != L'[')) {
    iVar2 = XMLString::indexOf(pXVar5,L':');
LAB_0026924c:
    if (iVar2 != -1) {
      XMLString::subString(toDelete,pXVar5,0,(long)iVar2,this->fMemoryManager);
      bVar8 = iVar2 != -2;
      uVar7 = (long)iVar2 + uVar7 + 1;
      goto LAB_00269293;
    }
  }
  else {
    iVar2 = XMLString::indexOf(pXVar5,L']');
    if (((iVar2 != -1) && (uVar4 = (long)iVar2 + uVar7 + 1, uVar4 < XVar3)) &&
       (uriSpec[uVar4] == L':')) {
      iVar2 = iVar2 + 1;
      goto LAB_0026924c;
    }
  }
  bVar8 = false;
  XMLString::subString(toDelete,pXVar5,0,XVar3 - uVar7,this->fMemoryManager);
  uVar7 = XVar3;
LAB_00269293:
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar1);
  pXVar5 = (XMLCh *)CONCAT44(extraout_var_01,iVar2);
  ArrayJanitor<char16_t>::ArrayJanitor(&portName,pXVar5,this->fMemoryManager);
  iVar2 = -1;
  if (((toDelete != (XMLCh *)0x0) && ((bool)(*toDelete != L'\0' & bVar8))) &&
     ((uVar7 <= XVar3 && XVar3 - uVar7 != 0 &&
      ((XMLString::subString(pXVar5,uriSpec + uVar7,0,XVar3 - uVar7,this->fMemoryManager),
       pXVar5 != (XMLCh *)0x0 && (*pXVar5 != L'\0')))))) {
    iVar2 = XMLString::parseInt(pXVar5,this->fMemoryManager);
  }
  bVar8 = isValidServerBasedAuthority(toDelete,iVar2,pXVar6,this->fMemoryManager);
  if (bVar8) {
    if (this->fHost != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    if (this->fUserInfo != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    pXVar5 = XMLString::replicate(toDelete,this->fMemoryManager);
    this->fHost = pXVar5;
    this->fPort = iVar2;
    pXVar6 = XMLString::replicate(pXVar6,this->fMemoryManager);
    this->fUserInfo = pXVar6;
  }
  else {
    setRegBasedAuthority(this,uriSpec);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&portName);
  ArrayJanitor<char16_t>::~ArrayJanitor(&hostName);
  ArrayJanitor<char16_t>::~ArrayJanitor(&userName);
  return;
}

Assistant:

void XMLUri::initializeAuthority(const XMLCh* const uriSpec)
{

    int index = 0;
    XMLSize_t start = 0;
    const XMLSize_t end = XMLString::stringLen(uriSpec);

    //
    // server = [ [ userinfo "@" ] hostport ]
    // userinfo is everything up @,
    //
    XMLCh* userinfo = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> userName(userinfo, fMemoryManager);
    index = XMLString::indexOf(&(uriSpec[start]), chAt);

    if ( index != -1)
    {
        XMLString::subString(userinfo, &(uriSpec[start]), 0, index, fMemoryManager);
        index++; // skip the @
        start += index;
    }
    else
    {
        userinfo = 0;
    }

    //
    // hostport = host [ ":" port ]
    // host is everything up to ':', or up to
    // and including ']' if followed by ':'.
    //
    XMLCh* host = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> hostName(host, fMemoryManager);

    // Search for port boundary.
    if (start < end && uriSpec[start] == chOpenSquare)
    {
    	index = XMLString::indexOf(&(uriSpec[start]), chCloseSquare);
    	if (index != -1)
    	{
            // skip the ']'
            index = ((start + index + 1) < end
              && uriSpec[start + index + 1] == chColon) ? index+1 : -1;
    	}
    }
    else
    {
        index = XMLString::indexOf(&(uriSpec[start]), chColon);
    }

    if ( index != -1 )
    {
        XMLString::subString(host, &(uriSpec[start]), 0, index, fMemoryManager);
        index++;  // skip the :
        start +=index;
    }
    else
    {
        XMLString::subString(host, &(uriSpec[start]), 0, end-start, fMemoryManager);
        start = end;
    }

    // port is everything after ":"

    XMLCh* portStr = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> portName(portStr, fMemoryManager);
    int port = -1;

    if ((host && *host) &&   // non empty host
        (index != -1)                    &&   // ":" found
        (start < end)                     )   // ":" is not the last
    {
        XMLString::subString(portStr, &(uriSpec[start]), 0, end-start, fMemoryManager);

        if (portStr && *portStr)
        {
            port = XMLString::parseInt(portStr, fMemoryManager);
        }
    } // if > 0

    // Check if we have server based authority.
    if (isValidServerBasedAuthority(host, port, userinfo, fMemoryManager))
    {
        if (fHost)
            fMemoryManager->deallocate(fHost);//delete [] fHost;

        if (fUserInfo)
            fMemoryManager->deallocate(fUserInfo);//delete[] fUserInfo;

        fHost = XMLString::replicate(host, fMemoryManager);
        fPort = port;
        fUserInfo = XMLString::replicate(userinfo, fMemoryManager);

        return;
    }
    // This must be registry based authority or the URI is malformed.
    setRegBasedAuthority(uriSpec);
}